

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O1

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::push_back
          (circular_q<spdlog::details::log_msg_buffer> *this,log_msg_buffer *item)

{
  ulong uVar1;
  
  if (this->max_items_ != 0) {
    log_msg_buffer::operator=
              ((this->v_).
               super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
               ._M_impl.super__Vector_impl_data._M_start + this->tail_,item);
    uVar1 = (this->tail_ + 1) % this->max_items_;
    this->tail_ = uVar1;
    if (uVar1 == this->head_) {
      this->head_ = (this->head_ + 1) % this->max_items_;
      this->overrun_counter_ = this->overrun_counter_ + 1;
    }
  }
  return;
}

Assistant:

void push_back(T &&item)
    {
        if (max_items_ > 0)
        {
            v_[tail_] = std::move(item);
            tail_ = (tail_ + 1) % max_items_;

            if (tail_ == head_) // overrun last item if full
            {
                head_ = (head_ + 1) % max_items_;
                ++overrun_counter_;
            }
        }
    }